

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

jx9_hashmap_node *
HashmapNodeMerge(jx9_hashmap_node *pA,jx9_hashmap_node *pB,ProcNodeCmp xCmp,void *pCmpData)

{
  sxi32 sVar1;
  jx9_hashmap_node *pjVar2;
  jx9_hashmap_node *pjVar3;
  jx9_hashmap_node *pjVar4;
  bool bVar5;
  bool bVar6;
  jx9_hashmap_node jStack_88;
  
  pjVar3 = &jStack_88;
  pjVar4 = &jStack_88;
  bVar5 = pA != (jx9_hashmap_node *)0x0;
  bVar6 = pB != (jx9_hashmap_node *)0x0;
  jStack_88.pNext = (jx9_hashmap_node *)0x0;
  jStack_88.pPrev = (jx9_hashmap_node *)0x0;
  pjVar2 = pB;
  if (bVar5 && bVar6) {
    do {
      pjVar4 = pA;
      sVar1 = (*xCmp)(pjVar4,pjVar2,pCmpData);
      if (sVar1 < 0) {
        pjVar3->pPrev = pjVar4;
        pjVar4->pNext = pjVar3;
        pA = pjVar4->pPrev;
        pB = pjVar2;
      }
      else {
        pjVar3->pPrev = pjVar2;
        pjVar2->pNext = pjVar3;
        pB = pjVar2->pPrev;
        pA = pjVar4;
        pjVar4 = pjVar2;
      }
      bVar6 = pB != (jx9_hashmap_node *)0x0;
      bVar5 = pA != (jx9_hashmap_node *)0x0;
    } while ((bVar5) && (pjVar2 = pB, pjVar3 = pjVar4, pB != (jx9_hashmap_node *)0x0));
  }
  if (bVar5) {
    pjVar4->pPrev = pA;
    pA->pNext = pjVar4;
  }
  else if (bVar6) {
    pjVar4->pPrev = pB;
    pB->pNext = pjVar4;
  }
  else {
    pjVar4->pNext = (jx9_hashmap_node *)0x0;
    pjVar4->pPrev = (jx9_hashmap_node *)0x0;
  }
  return jStack_88.pPrev;
}

Assistant:

static jx9_hashmap_node * HashmapNodeMerge(jx9_hashmap_node *pA, jx9_hashmap_node *pB, ProcNodeCmp xCmp, void *pCmpData)
{
	jx9_hashmap_node result, *pTail;
    /* Prevent compiler warning */
	result.pNext = result.pPrev = 0;
	pTail = &result;
	while( pA && pB ){
		if( xCmp(pA, pB, pCmpData) < 0 ){
			pTail->pPrev = pA;
			pA->pNext = pTail;
			pTail = pA;
			pA = pA->pPrev;
		}else{
			pTail->pPrev = pB;
			pB->pNext = pTail;
			pTail = pB;
			pB = pB->pPrev;
		}
	}
	if( pA ){
		pTail->pPrev = pA;
		pA->pNext = pTail;
	}else if( pB ){
		pTail->pPrev = pB;
		pB->pNext = pTail;
	}else{
		pTail->pPrev = pTail->pNext = 0;
	}
	return result.pPrev;
}